

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

int ON_Material::CompareTextureAttributesAppearance(ON_Material *a,ON_Material *b)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  
  iVar1 = (a->m_textures).super_ON_ClassArray<ON_Texture>.m_count;
  iVar2 = iVar1 - (b->m_textures).super_ON_ClassArray<ON_Texture>.m_count;
  bVar5 = iVar2 == 0;
  if (0 < (long)iVar1 && bVar5) {
    uVar3 = 1;
    lVar4 = 0;
    do {
      iVar2 = ON_Texture::CompareAppearance
                        ((ON_Texture *)
                         ((long)&((ON_Texture *)
                                 (&((ON_Texture *)
                                   (&((ON_Texture *)
                                     (&((a->m_textures).super_ON_ClassArray<ON_Texture>.m_a)->
                                       m_texture_id + -1))->m_texture_id + -1))->m_texture_id + -1))
                                 ->m_texture_id + lVar4 + 0xfffffffffffffff0U),
                         (ON_Texture *)
                         ((long)&((ON_Texture *)
                                 (&((ON_Texture *)
                                   (&((ON_Texture *)
                                     (&((b->m_textures).super_ON_ClassArray<ON_Texture>.m_a)->
                                       m_texture_id + -1))->m_texture_id + -1))->m_texture_id + -1))
                                 ->m_texture_id + lVar4 + 0xfffffffffffffff0U));
      bVar5 = iVar2 == 0;
      if ((ulong)(long)iVar1 <= uVar3) break;
      lVar4 = lVar4 + 0x200;
      uVar3 = uVar3 + 1;
    } while (iVar2 == 0);
  }
  iVar1 = (uint)a->m_bUseDiffuseTextureAlphaForObjectTransparencyTexture -
          (uint)b->m_bUseDiffuseTextureAlphaForObjectTransparencyTexture;
  if (!bVar5) {
    iVar1 = iVar2;
  }
  return iVar1;
}

Assistant:

int ON_Material::CompareTextureAttributesAppearance(const ON_Material& a, const ON_Material& b)
{
  // do NOT test index or id

  const int tcount = a.m_textures.Count();
  int rc = tcount - b.m_textures.Count();
  for (int i = 0; i < tcount && 0 == rc; i++)
  {
    rc = ON_Texture::CompareAppearance(a.m_textures[i], b.m_textures[i]);
  }
  if (0 == rc)
    rc = ((int)a.m_bUseDiffuseTextureAlphaForObjectTransparencyTexture) - ((int)b.m_bUseDiffuseTextureAlphaForObjectTransparencyTexture);


  return rc;
}